

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::PassthruFragShader::shadeFragments
          (PassthruFragShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  undefined1 local_4c [8];
  Vec4 color;
  deUint32 fragNdx;
  FragmentPacket *packet;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  PassthruFragShader *this_local;
  
  for (packet._4_4_ = 0; packet._4_4_ < numPackets; packet._4_4_ = packet._4_4_ + 1) {
    register0x00000000 = packets + packet._4_4_;
    for (color.m_data[2] = 0.0; (uint)color.m_data[2] < 4;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      rr::readVarying<float>((rr *)local_4c,stack0xffffffffffffffc8,context,0,(int)color.m_data[2]);
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                (context,packet._4_4_,(int)color.m_data[2],0,(Vector<float,_4> *)local_4c);
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			rr::FragmentPacket& packet = packets[packetNdx];
			for (deUint32 fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; ++fragNdx)
			{
				tcu::Vec4 color = rr::readVarying<float>(packet, context, 0, fragNdx);
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			}
		}
	}